

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O0

off_t cm_zlib_gzoffset64(gzFile file)

{
  gz_statep state;
  off_t offset;
  gzFile file_local;
  
  if (file == (gzFile)0x0) {
    file_local = (gzFile)0xffffffffffffffff;
  }
  else if ((file[1].have == 0x1c4f) || (file[1].have == 0x79b1)) {
    state = (gz_statep)lseek(*(int *)&file[1].field_0x4,0,1);
    if (state == (gz_statep)0xffffffffffffffff) {
      file_local = (gzFile)0xffffffffffffffff;
    }
    else {
      if (file[1].have == 0x1c4f) {
        state = (gz_statep)((long)state - (ulong)(uint)file[5].pos);
      }
      file_local = &state->x;
    }
  }
  else {
    file_local = (gzFile)0xffffffffffffffff;
  }
  return (off_t)file_local;
}

Assistant:

z_off64_t ZEXPORT gzoffset64(file)
    gzFile file;
{
    z_off64_t offset;
    gz_statep state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return -1;

    /* compute and return effective offset in file */
    offset = LSEEK(state->fd, 0, SEEK_CUR);
    if (offset == -1)
        return -1;
    if (state->mode == GZ_READ)             /* reading */
        offset -= state->strm.avail_in;     /* don't count buffered input */
    return offset;
}